

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.h
# Opt level: O3

void cvarfunc_fluid_chorus_voices(FIntCVar *self)

{
  UCVarValue value;
  
  if (self->Value < 0) {
    value.String = (char *)0x0;
  }
  else {
    if ((uint)self->Value < 100) {
      if (currSong != (MusInfo *)0x0) {
        (*currSong->_vptr_MusInfo[0x11])(currSong,"z.chorus-changed",0);
        return;
      }
      return;
    }
    value = (UCVarValue)0x63;
  }
  FBaseCVar::SetGenericRep(&self->super_FBaseCVar,value,CVAR_Int);
  return;
}

Assistant:

inline operator int () const { return Value; }